

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_mac.c
# Opt level: O0

void test_compat_mac_1(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  size_t local_48;
  size_t attrSize;
  void *attr;
  archive *a;
  archive_entry *ae;
  char name [24];
  
  ae = (archive_entry *)0x6d6f635f74736574;
  builtin_strncpy(name,"pat_mac-1.tar.Z",0x10);
  attr = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                   ,L'4',(uint)((archive *)attr != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)attr);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",attr);
  iVar1 = archive_read_support_format_all((archive *)attr);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",attr);
  iVar1 = archive_read_set_options((archive *)attr,"mac-ext");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_read_set_options(a, \"mac-ext\")",
                      attr);
  extract_reference_file((char *)&ae);
  wVar2 = archive_read_open_filename((archive_conflict *)attr,(char *)&ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'9',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      attr);
  iVar1 = archive_read_next_header((archive *)attr,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",attr);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'<',
             "abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/"
             ,"TESTPATH",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'=',0x4c0974ad,"1275688109",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'>',0x1756a,"95594",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  pcVar4 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'?',"kientzle","\"kientzle\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'@',5000,"5000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  pcVar4 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'A',"","\"\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'B',0x41ed,"040755",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  attrSize = (size_t)archive_entry_mac_metadata((archive_entry *)a,&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                   ,L'E',(uint)((void *)attrSize == (void *)0x0),"attr == NULL",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'F',0,"0",local_48,"attrSize",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)attr,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",attr);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'I',
             "abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/dir/"
             ,"TESTPATH \"dir/\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'J',0x4c0972bb,"1275687611",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'K',0x1756a,"95594",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  pcVar4 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'L',"kientzle","\"kientzle\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'M',5000,"5000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  pcVar4 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'N',"","\"\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'O',0x41ed,"040755",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  attrSize = (size_t)archive_entry_mac_metadata((archive_entry *)a,&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                   ,L'R',(uint)((void *)attrSize != (void *)0x0),"attr != NULL",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'S',0xe1,"225",local_48,"attrSize",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)attr,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",attr);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'V',
             "abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/abcdefghijklmnopqrstuvwxyz/file"
             ,"TESTPATH \"file\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'W',0x4c0972a4,"1275687588",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'X',0x1756a,"95594",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  pcVar4 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'Y',"kientzle","\"kientzle\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'Z',5000,"5000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  pcVar4 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'[',"","\"\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'\\',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  attrSize = (size_t)archive_entry_mac_metadata((archive_entry *)a,&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                   ,L'_',(uint)((void *)attrSize != (void *)0x0),"attr != NULL",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'`',0xe1,"225",local_48,"attrSize",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)attr,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",attr);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'c',"dir/","\"dir/\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'd',0x4c097480,"1275688064",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'e',0x1756a,"95594",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  pcVar4 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'f',"kientzle","\"kientzle\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'g',5000,"5000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  pcVar4 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'h',"","\"\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'i',0x41ed,"040755",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  attrSize = (size_t)archive_entry_mac_metadata((archive_entry *)a,&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                   ,L'l',(uint)((void *)attrSize != (void *)0x0),"attr != NULL",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'm',0xe1,"225",local_48,"attrSize",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'n',"","\"\\x00\\x05\\x16\\x07\\x00\\x02\\x00\\x00Mac OS X\"",
                      (void *)attrSize,"attr",0x10,"16",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)attr,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",attr);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'q',"file","\"file\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'r',0x4c088184,"1275625860",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L's',0x1756a,"95594",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  pcVar4 = archive_entry_uname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L't',"kientzle","\"kientzle\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'u',5000,"5000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  pcVar4 = archive_entry_gname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
             ,L'v',"","\"\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'w',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  attrSize = (size_t)archive_entry_mac_metadata((archive_entry *)a,&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                   ,L'z',(uint)((void *)attrSize != (void *)0x0),"attr != NULL",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'{',0xe1,"225",local_48,"attrSize",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'|',"","\"\\x00\\x05\\x16\\x07\\x00\\x02\\x00\\x00Mac OS X\"",
                      (void *)attrSize,"attr",0x10,"16",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)attr,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'\x7f',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",attr);
  iVar1 = archive_filter_code((archive *)attr,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'\x82',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)attr);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'\x83',(long)iVar1,"archive_format(a)",0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",
                      (void *)0x0);
  iVar1 = archive_read_close((archive *)attr);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)attr);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_mac.c"
                      ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_compat_mac_1(void)
{
	char name[] = "test_compat_mac-1.tar.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *attr;
	size_t attrSize;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_set_options(a, "mac-ext"));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(TESTPATH, archive_entry_pathname(ae));
	assertEqualInt(1275688109, archive_entry_mtime(ae));
	assertEqualInt(95594, archive_entry_uid(ae));
	assertEqualString("kientzle", archive_entry_uname(ae));
	assertEqualInt(5000, archive_entry_gid(ae));
	assertEqualString("", archive_entry_gname(ae));
	assertEqualInt(040755, archive_entry_mode(ae));

	attr = archive_entry_mac_metadata(ae, &attrSize);
	assert(attr == NULL);
	assertEqualInt(0, attrSize);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(TESTPATH "dir/", archive_entry_pathname(ae));
	assertEqualInt(1275687611, archive_entry_mtime(ae));
	assertEqualInt(95594, archive_entry_uid(ae));
	assertEqualString("kientzle", archive_entry_uname(ae));
	assertEqualInt(5000, archive_entry_gid(ae));
	assertEqualString("", archive_entry_gname(ae));
	assertEqualInt(040755, archive_entry_mode(ae));

	attr = archive_entry_mac_metadata(ae, &attrSize);
	assert(attr != NULL);
	assertEqualInt(225, attrSize);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(TESTPATH "file", archive_entry_pathname(ae));
	assertEqualInt(1275687588, archive_entry_mtime(ae));
	assertEqualInt(95594, archive_entry_uid(ae));
	assertEqualString("kientzle", archive_entry_uname(ae));
	assertEqualInt(5000, archive_entry_gid(ae));
	assertEqualString("", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	attr = archive_entry_mac_metadata(ae, &attrSize);
	assert(attr != NULL);
	assertEqualInt(225, attrSize);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	assertEqualInt(1275688064, archive_entry_mtime(ae));
	assertEqualInt(95594, archive_entry_uid(ae));
	assertEqualString("kientzle", archive_entry_uname(ae));
	assertEqualInt(5000, archive_entry_gid(ae));
	assertEqualString("", archive_entry_gname(ae));
	assertEqualInt(040755, archive_entry_mode(ae));

	attr = archive_entry_mac_metadata(ae, &attrSize);
	assert(attr != NULL);
	assertEqualInt(225, attrSize);
	assertEqualMem("\x00\x05\x16\x07\x00\x02\x00\x00Mac OS X", attr, 16);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(1275625860, archive_entry_mtime(ae));
	assertEqualInt(95594, archive_entry_uid(ae));
	assertEqualString("kientzle", archive_entry_uname(ae));
	assertEqualInt(5000, archive_entry_gid(ae));
	assertEqualString("", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	attr = archive_entry_mac_metadata(ae, &attrSize);
	assert(attr != NULL);
	assertEqualInt(225, attrSize);
	assertEqualMem("\x00\x05\x16\x07\x00\x02\x00\x00Mac OS X", attr, 16);

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_GNUTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}